

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

_Bool import_encrypted_s(Filename *filename,BinarySource *src,int type,char **comment)

{
  _Bool _Var1;
  char *pcVar2;
  sshcom_key *s;
  unsigned_long uVar3;
  size_t n;
  undefined1 uVar4;
  ptrlen pl;
  BinarySource local_48;
  
  if (type != 7) {
    if (type == 6) {
      pcVar2 = filename_to_str(filename);
      pcVar2 = dupstr(pcVar2);
      *comment = pcVar2;
      s = (sshcom_key *)load_openssh_new_key(src,(char **)0x0);
      if (s == (sshcom_key *)0x0) {
        return false;
      }
      uVar4 = *(openssh_new_cipher *)s->comment != ON_E_NONE;
      strbuf_free(*(strbuf **)((long)s->comment + 0x38));
      n = 0x40;
    }
    else {
      if (type != 5) {
        return false;
      }
      pcVar2 = filename_to_str(filename);
      pcVar2 = dupstr(pcVar2);
      *comment = pcVar2;
      s = (sshcom_key *)load_openssh_pem_key(src,(char **)0x0);
      if (s == (sshcom_key *)0x0) {
        return false;
      }
      uVar4 = *(_Bool *)((long)s->comment + 4);
      strbuf_free(*(strbuf **)((long)s->comment + 0x30));
      n = 0x38;
    }
    smemclr(s,n);
    goto LAB_0011172e;
  }
  s = load_sshcom_key(src,(char **)0x0);
  *comment = (char *)0x0;
  if (s == (sshcom_key *)0x0) {
    pcVar2 = dupstr("");
    *comment = pcVar2;
    return false;
  }
  local_48.data = s->keyblob->u;
  local_48.len = s->keyblob->len;
  local_48.pos = 0;
  local_48.err = BSE_NO_ERROR;
  local_48.binarysource_ = &local_48;
  uVar3 = BinarySource_get_uint32(&local_48);
  if (uVar3 == 0x3f6ff9eb) {
    BinarySource_get_uint32(local_48.binarysource_);
    BinarySource_get_string(local_48.binarysource_);
    pl = BinarySource_get_string(local_48.binarysource_);
    if ((local_48.binarysource_)->err != BSE_NO_ERROR) goto LAB_00111704;
    _Var1 = ptrlen_eq_string(pl,"none");
    uVar4 = !_Var1;
  }
  else {
LAB_00111704:
    uVar4 = false;
  }
  pcVar2 = dupstr(s->comment);
  *comment = pcVar2;
  strbuf_free(s->keyblob);
  smemclr(s,0x108);
LAB_0011172e:
  safefree(s);
  return (_Bool)uVar4;
}

Assistant:

bool import_encrypted_s(const Filename *filename, BinarySource *src,
                        int type, char **comment)
{
    if (type == SSH_KEYTYPE_OPENSSH_PEM) {
        /* OpenSSH PEM format doesn't contain a key comment at all */
        *comment = dupstr(filename_to_str(filename));
        return openssh_pem_encrypted(src);
    } else if (type == SSH_KEYTYPE_OPENSSH_NEW) {
        /* OpenSSH new format does, but it's inside the encrypted
         * section for some reason */
        *comment = dupstr(filename_to_str(filename));
        return openssh_new_encrypted(src);
    } else if (type == SSH_KEYTYPE_SSHCOM) {
        return sshcom_encrypted(src, comment);
    }
    return false;
}